

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Read<int> __thiscall Omega_h::ternary_each<int>(Omega_h *this,Bytes *cond,Read<int> *a,Read<int> *b)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  int b_00;
  ulong uVar5;
  size_t sVar6;
  Read<int> RVar7;
  Write<int> c;
  type f;
  Write<int> local_a8;
  int local_8c;
  Write<int> local_88;
  type local_78;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar5 = pAVar2->size;
  }
  else {
    uVar5 = (ulong)pAVar2 >> 3;
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar6 = pAVar3->size;
  }
  else {
    sVar6 = (ulong)pAVar3 >> 3;
  }
  if ((int)(uVar5 >> 2) == (int)(sVar6 >> 2)) {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar6 = pAVar2->size;
    }
    else {
      sVar6 = (ulong)pAVar2 >> 3;
    }
    pAVar2 = (cond->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      b_00 = (int)pAVar2->size;
    }
    else {
      b_00 = (int)((ulong)pAVar2 >> 3);
    }
    local_8c = divide_no_remainder<int>((int)(sVar6 >> 2),b_00);
    pAVar2 = (a->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      sVar6 = pAVar2->size;
    }
    else {
      sVar6 = (ulong)pAVar2 >> 3;
    }
    local_78.c.shared_alloc_.alloc = (Alloc *)&local_78.cond;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    Write<int>::Write(&local_a8,(LO)(sVar6 >> 2),(string *)&local_78);
    if (local_78.c.shared_alloc_.alloc != (Alloc *)&local_78.cond) {
      operator_delete(local_78.c.shared_alloc_.alloc,
                      (ulong)((long)&(local_78.cond.write_.shared_alloc_.alloc)->size + 1));
    }
    local_78.c.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.c.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.c.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
    local_78.cond.write_.shared_alloc_.alloc = (cond->write_).shared_alloc_.alloc;
    if (((ulong)local_78.cond.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.cond.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.cond.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.cond.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.cond.write_.shared_alloc_.alloc)->use_count =
             (local_78.cond.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.cond.write_.shared_alloc_.direct_ptr = (cond->write_).shared_alloc_.direct_ptr;
    local_78.width = local_8c;
    local_78.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_78.a.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.a.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.a.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.a.write_.shared_alloc_.alloc)->use_count =
             (local_78.a.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    local_78.b.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_78.b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.b.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.b.write_.shared_alloc_.alloc)->use_count =
             (local_78.b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.b.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
    if (((ulong)local_a8.shared_alloc_.alloc & 1) == 0) {
      uVar5 = (local_a8.shared_alloc_.alloc)->size;
    }
    else {
      uVar5 = (ulong)local_a8.shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::ternary_each<int>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Read<int>)::_lambda(int)_1_>
              ((LO)(uVar5 >> 2),&local_78,"ternary_each");
    local_88.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
    local_88.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_88.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)this,&local_88);
    pAVar2 = local_88.shared_alloc_.alloc;
    if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
        local_88.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    ternary_each<int>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Read<int>)::
    {lambda(int)#1}::~Read((_lambda_int__1_ *)&local_78);
    pAVar2 = local_a8.shared_alloc_.alloc;
    pvVar4 = extraout_RDX;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar7.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x137);
}

Assistant:

Read<T> ternary_each(Bytes cond, Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto width = divide_no_remainder(a.size(), cond.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = cond[i / width] ? a[i] : b[i]; };
  parallel_for(c.size(), f, "ternary_each");
  return c;
}